

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status __thiscall
google::protobuf::anon_unknown_21::ValidateDescriptor(anon_unknown_21 *this,Descriptor *descriptor)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  Edition EVar5;
  FieldDescriptor *this_00;
  FieldOptions *pFVar6;
  RepeatedField<int> *this_01;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this_02;
  reference this_03;
  EnumDescriptor *pEVar7;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  basic_string_view<char,_std::char_traits<char>_> args_1_01;
  basic_string_view<char,_std::char_traits<char>_> args_1_02;
  basic_string_view<char,_std::char_traits<char>_> args_1_03;
  basic_string_view<char,_std::char_traits<char>_> args_1_04;
  string_view sVar8;
  char *local_b0;
  char *local_a8;
  FieldOptions_EditionDefault *d;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *__range3;
  char *pcStack_78;
  bool has_legacy_default;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  FieldDescriptor *field;
  char *pcStack_28;
  int i;
  char *local_20;
  Descriptor *descriptor_local;
  Status *_status;
  
  iVar3 = Descriptor::oneof_decl_count(descriptor);
  if (iVar3 < 1) {
    for (field._4_4_ = 0; iVar3 = Descriptor::field_count(descriptor), field._4_4_ < iVar3;
        field._4_4_ = field._4_4_ + 1) {
      this_00 = Descriptor::field(descriptor,field._4_4_);
      bVar1 = FieldDescriptor::is_required(this_00);
      if (bVar1) {
        sVar8 = FieldDescriptor::full_name(this_00);
        local_48 = (char *)sVar8._M_len;
        local_40 = sVar8._M_str;
        args_1_00._M_str = local_48;
        args_1_00._M_len = (size_t)"Feature field ";
        protobuf::(anonymous_namespace)::
        Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                  ((char *)this,args_1_00,local_40);
        return (Status)(uintptr_t)this;
      }
      bVar1 = FieldDescriptor::is_repeated(this_00);
      if (bVar1) {
        sVar8 = FieldDescriptor::full_name(this_00);
        local_58 = (char *)sVar8._M_len;
        local_50 = sVar8._M_str;
        args_1_01._M_str = local_58;
        args_1_01._M_len = (size_t)"Feature field ";
        protobuf::(anonymous_namespace)::
        Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                  ((char *)this,args_1_01,local_50);
        return (Status)(uintptr_t)this;
      }
      TVar4 = FieldDescriptor::type(this_00);
      if ((TVar4 != TYPE_ENUM) && (TVar4 = FieldDescriptor::type(this_00), TVar4 != TYPE_BOOL)) {
        sVar8 = FieldDescriptor::full_name(this_00);
        local_68 = (char *)sVar8._M_len;
        local_60 = sVar8._M_str;
        args_1_02._M_str = local_68;
        args_1_02._M_len = (size_t)"Feature field ";
        protobuf::(anonymous_namespace)::
        Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                  ((char *)this,args_1_02,local_60);
        return (Status)(uintptr_t)this;
      }
      pFVar6 = FieldDescriptor::options(this_00);
      this_01 = FieldOptions::targets(pFVar6);
      bVar1 = RepeatedField<int>::empty(this_01);
      if (bVar1) {
        sVar8 = FieldDescriptor::full_name(this_00);
        pcStack_78 = (char *)sVar8._M_len;
        local_70 = sVar8._M_str;
        args_1_03._M_str = pcStack_78;
        args_1_03._M_len = (size_t)"Feature field ";
        protobuf::(anonymous_namespace)::
        Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                  ((char *)this,args_1_03,local_70);
        return (Status)(uintptr_t)this;
      }
      bVar1 = false;
      pFVar6 = FieldDescriptor::options(this_00);
      this_02 = FieldOptions::edition_defaults(pFVar6);
      __end3 = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::begin(this_02);
      d = (FieldOptions_EditionDefault *)
          RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::end(this_02);
      while (bVar2 = internal::operator!=(&__end3,(iterator *)&d), bVar2) {
        this_03 = internal::RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>
                  ::operator*(&__end3);
        EVar5 = FieldOptions_EditionDefault::edition(this_03);
        if (EVar5 == EDITION_LEGACY) {
          bVar1 = true;
        }
        internal::RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>::
        operator++(&__end3);
      }
      if (!bVar1) {
        sVar8 = FieldDescriptor::full_name(this_00);
        local_b0 = (char *)sVar8._M_len;
        local_a8 = sVar8._M_str;
        args_1_04._M_str = local_b0;
        args_1_04._M_len = (size_t)"Feature field ";
        protobuf::(anonymous_namespace)::
        Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                  ((char *)this,args_1_04,local_a8);
        return (Status)(uintptr_t)this;
      }
      ValidateFieldFeatureSupport(this,this_00);
      bVar1 = absl::lts_20250127::Status::ok((Status *)this);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return (Status)(uintptr_t)this;
      }
      absl::lts_20250127::Status::~Status((Status *)this);
      pEVar7 = FieldDescriptor::enum_type(this_00);
      if (pEVar7 != (EnumDescriptor *)0x0) {
        ValidateValuesFeatureSupport(this,this_00);
        bVar1 = absl::lts_20250127::Status::ok((Status *)this);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return (Status)(uintptr_t)this;
        }
        absl::lts_20250127::Status::~Status((Status *)this);
      }
    }
    absl::lts_20250127::OkStatus();
  }
  else {
    sVar8 = Descriptor::full_name(descriptor);
    pcStack_28 = (char *)sVar8._M_len;
    local_20 = sVar8._M_str;
    args_1._M_str = pcStack_28;
    args_1._M_len = (size_t)"Type ";
    protobuf::(anonymous_namespace)::
    Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
              ((char *)this,args_1,local_20);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateDescriptor(const Descriptor& descriptor) {
  if (descriptor.oneof_decl_count() > 0) {
    return Error("Type ", descriptor.full_name(),
                 " contains unsupported oneof feature fields.");
  }
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);

    if (field.is_required()) {
      return Error("Feature field ", field.full_name(),
                   " is an unsupported required field.");
    }
    if (field.is_repeated()) {
      return Error("Feature field ", field.full_name(),
                   " is an unsupported repeated field.");
    }
    if (field.type() != FieldDescriptor::TYPE_ENUM &&
        field.type() != FieldDescriptor::TYPE_BOOL) {
      return Error("Feature field ", field.full_name(),
                   " is not an enum or boolean.");
    }
    if (field.options().targets().empty()) {
      return Error("Feature field ", field.full_name(),
                   " has no target specified.");
    }

    bool has_legacy_default = false;
    for (const auto& d : field.options().edition_defaults()) {
      if (d.edition() == Edition::EDITION_LEGACY) {
        has_legacy_default = true;
        continue;
      }
    }
    if (!has_legacy_default) {
      return Error("Feature field ", field.full_name(),
                   " has no default specified for EDITION_LEGACY, before it "
                   "was introduced.");
    }

    RETURN_IF_ERROR(ValidateFieldFeatureSupport(field));
    if (field.enum_type() != nullptr) {
      RETURN_IF_ERROR(ValidateValuesFeatureSupport(field));
    }
  }

  return absl::OkStatus();
}